

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int moveto_attr_alldesc(lyxp_set *set,lyd_node *cur_node,char *qname,uint16_t qname_len,int options)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  LY_ERR *pLVar5;
  lyxp_set *set_00;
  uint16_t mod_nam_ns_len;
  lyxp_set *set_all_desc;
  lys_module *moveto_mod;
  lyd_attr *sub;
  int ret;
  int all;
  int replaced;
  int pref_len;
  uint32_t i;
  int options_local;
  uint16_t qname_len_local;
  char *qname_local;
  lyd_node *cur_node_local;
  lyxp_set *set_local;
  
  bVar1 = false;
  if ((set == (lyxp_set *)0x0) || (set->type == LYXP_SET_EMPTY)) {
    set_local._4_4_ = 0;
  }
  else if (set->type == LYXP_SET_NODE_SET) {
    pcVar4 = strnchr(qname,0x3a,(uint)qname_len);
    if (pcVar4 == (char *)0x0) {
      set_all_desc = (lyxp_set *)0x0;
      i._2_2_ = qname_len;
      _options_local = qname;
    }
    else {
      pcVar4 = strnchr(qname,0x3a,(uint)qname_len);
      iVar3 = (int)pcVar4 - (int)qname;
      mod_nam_ns_len = (uint16_t)iVar3;
      set_all_desc = (lyxp_set *)
                     moveto_resolve_model
                               (qname,mod_nam_ns_len,cur_node->schema->module->ctx,(lys_node *)0x0,1
                               );
      if ((lys_module *)set_all_desc == (lys_module *)0x0) {
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
               ,0x13b8);
        return -1;
      }
      _options_local = qname + (iVar3 + 1);
      i._2_2_ = qname_len - (mod_nam_ns_len + 1);
    }
    set_00 = set_copy(set);
    set_local._4_4_ = moveto_node_alldesc(set_00,cur_node,"*",1,options);
    if (set_local._4_4_ == 0) {
      iVar3 = moveto_union(set,set_00,cur_node,options);
      if (iVar3 == 0) {
        lyxp_set_free(set_00);
        if ((i._2_2_ == 1) && (*_options_local == '*')) {
          bVar1 = true;
        }
        replaced = 0;
        while ((uint)replaced < set->used) {
          bVar2 = false;
          if ((set->val).nodes[(uint)replaced].type == LYXP_NODE_ELEM) {
            for (moveto_mod = (lys_module *)((set->val).nodes[(uint)replaced].node)->attr;
                moveto_mod != (lys_module *)0x0; moveto_mod = (lys_module *)moveto_mod->name) {
              if (((set_all_desc == (lyxp_set *)0x0) ||
                  (*(lyxp_set **)(moveto_mod->prefix + 0x30) == set_all_desc)) &&
                 ((bVar1 || ((iVar3 = strncmp(moveto_mod->dsc,_options_local,(ulong)i._2_2_),
                             iVar3 == 0 && (moveto_mod->dsc[i._2_2_] == '\0')))))) {
                if (bVar2) {
                  set_insert_node(set,moveto_mod,(set->val).nodes[(uint)replaced].pos,LYXP_NODE_ATTR
                                  ,replaced + 1);
                }
                else {
                  (set->val).nodes[(uint)replaced].node = (lyd_node *)moveto_mod;
                  (set->val).nodes[(uint)replaced].type = LYXP_NODE_ATTR;
                  bVar2 = true;
                }
                replaced = replaced + 1;
              }
            }
          }
          if (!bVar2) {
            set_remove_node(set,replaced);
          }
        }
        set_local._4_4_ = 0;
      }
      else {
        lyxp_set_free(set_00);
        set_local._4_4_ = -1;
      }
    }
    else {
      lyxp_set_free(set_00);
    }
  }
  else {
    pcVar4 = print_set_type(set);
    ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar4);
    set_local._4_4_ = -1;
  }
  return set_local._4_4_;
}

Assistant:

static int
moveto_attr_alldesc(struct lyxp_set *set, struct lyd_node *cur_node, const char *qname, uint16_t qname_len,
                    int options)
{
    uint32_t i;
    int pref_len, replaced, all = 0, ret;
    struct lyd_attr *sub;
    struct lys_module *moveto_mod;
    struct lyxp_set *set_all_desc = NULL;

    if (!set || (set->type == LYXP_SET_EMPTY)) {
        return EXIT_SUCCESS;
    }

    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INOP_1, LY_VLOG_NONE, NULL, "path operator", print_set_type(set));
        return -1;
    }

    /* prefix */
    if (strnchr(qname, ':', qname_len)) {
        pref_len = strnchr(qname, ':', qname_len) - qname;
        moveto_mod = moveto_resolve_model(qname, pref_len, cur_node->schema->module->ctx, NULL, 1);
        if (!moveto_mod) {
            LOGINT;
            return -1;
        }
        qname += pref_len + 1;
        qname_len -= pref_len + 1;
    } else {
        moveto_mod = NULL;
    }

    /* can be optimized similarly to moveto_node_alldesc() and save considerable amount of memory,
     * but it likely won't be used much, so it's a waste of time */
    /* copy the context */
    set_all_desc = set_copy(set);
    /* get all descendant nodes (the original context nodes are removed) */
    ret = moveto_node_alldesc(set_all_desc, cur_node, "*", 1, options);
    if (ret) {
        lyxp_set_free(set_all_desc);
        return ret;
    }
    /* prepend the original context nodes */
    if (moveto_union(set, set_all_desc, cur_node, options)) {
        lyxp_set_free(set_all_desc);
        return -1;
    }
    lyxp_set_free(set_all_desc);

    if ((qname_len == 1) && (qname[0] == '*')) {
        all = 1;
    }

    for (i = 0; i < set->used; ) {
        replaced = 0;

        /* only attributes of an elem can be in the result, skip all the rest,
         * we have all attributes qualified in lyd tree */
        if (set->val.nodes[i].type == LYXP_NODE_ELEM) {
            LY_TREE_FOR(set->val.nodes[i].node->attr, sub) {
                /* check "namespace" */
                if (moveto_mod && (sub->annotation->module != moveto_mod)) {
                    /* no match */
                    continue;
                }

                if (all || (!strncmp(sub->name, qname, qname_len) && !sub->name[qname_len])) {
                    /* match */
                    if (!replaced) {
                        set->val.attrs[i].attr = sub;
                        set->val.attrs[i].type = LYXP_NODE_ATTR;
                        /* pos does not change */
                        replaced = 1;
                    } else {
                        set_insert_node(set, (struct lyd_node *)sub, set->val.attrs[i].pos, LYXP_NODE_ATTR, i + 1);
                    }
                    ++i;
                }
            }
        }

        if (!replaced) {
            /* no match */
            set_remove_node(set, i);
        }
    }

    return EXIT_SUCCESS;
}